

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O1

void anon_unknown.dwarf_c460d::traversePrePost
               (Ref node,function<void_(cashew::Ref)> *visitPre,
               function<void_(cashew::Ref)> *visitPost)

{
  undefined8 *puVar1;
  Value *pVVar2;
  pointer pRVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer pRVar7;
  pointer pTVar8;
  pointer pTVar9;
  pointer pTVar10;
  TraverseInfo *pTVar11;
  ulong uVar12;
  TraverseInfo *pTVar13;
  TraverseInfo *pTVar14;
  ulong uVar15;
  _Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  *p_Var16;
  Value *__n;
  Ref node_00;
  pointer pRVar17;
  long lVar18;
  TraverseInfo *pTVar19;
  undefined1 local_80 [24];
  pointer pRStack_68;
  pointer local_60;
  TraverseInfo *local_58;
  TraverseInfo *local_50;
  vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  local_48;
  
  local_48.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (TraverseInfo *)0x0;
  local_48.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (TraverseInfo *)0x0;
  local_48.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (TraverseInfo *)0x0;
  TraverseInfo::TraverseInfo((TraverseInfo *)local_80,node);
  pTVar9 = local_48.
           super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar8 = local_48.
           super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_48.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    lVar18 = (long)local_48.
                   super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.
                   super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar18 == 0x7ffffffffffffff8) {
LAB_00151f34:
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar12 = (lVar18 >> 3) * -0x3333333333333333;
    uVar15 = 1;
    if (local_48.
        super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_48.
        super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar15 = uVar12;
    }
    p_Var16 = (_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
               *)(uVar15 + uVar12);
    if ((_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
         *)0x333333333333332 < p_Var16) {
      p_Var16 = (_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                 *)0x333333333333333;
    }
    if (CARRY8(uVar15,uVar12)) {
      p_Var16 = (_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                 *)0x333333333333333;
    }
    pTVar10 = std::
              _Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
              ::_M_allocate(p_Var16,(size_t)node.inst);
    *(undefined1 *)((long)pTVar10 + lVar18 + 8) = local_80[8];
    *(undefined8 *)((long)pTVar10 + lVar18) = local_80._0_8_;
    puVar1 = (undefined8 *)((long)pTVar10 + lVar18 + 0x10);
    *puVar1 = local_80._16_8_;
    puVar1[1] = pRStack_68;
    *(pointer *)((long)pTVar10 + lVar18 + 0x20) = local_60;
    local_80._16_8_ = (pointer)0x0;
    pRStack_68 = (pointer)0x0;
    local_60 = (pointer)0x0;
    pTVar19 = pTVar10;
    for (pTVar11 = pTVar8; pTVar9 != pTVar11; pTVar11 = pTVar11 + 1) {
      pTVar19->scanned = pTVar11->scanned;
      (pTVar19->node).inst = (pTVar11->node).inst;
      uVar4 = *(undefined4 *)
               ((long)&(pTVar11->children).
                       super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
                       super__Vector_impl_data._M_start + 4);
      uVar5 = *(undefined4 *)
               &(pTVar11->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar6 = *(undefined4 *)
               ((long)&(pTVar11->children).
                       super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4);
      *(undefined4 *)
       &(pTVar19->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
        super__Vector_impl_data._M_start =
           *(undefined4 *)
            &(pTVar11->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
             _M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)
       ((long)&(pTVar19->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
               _M_impl.super__Vector_impl_data._M_start + 4) = uVar4;
      *(undefined4 *)
       &(pTVar19->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
        super__Vector_impl_data._M_finish = uVar5;
      *(undefined4 *)
       ((long)&(pTVar19->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
               _M_impl.super__Vector_impl_data._M_finish + 4) = uVar6;
      (pTVar19->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pTVar11->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      (pTVar11->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pTVar11->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pTVar11->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar19 = pTVar19 + 1;
    }
    if (pTVar8 != (TraverseInfo *)0x0) {
      operator_delete(pTVar8,(long)local_48.
                                   super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar8
                     );
    }
    local_48.
    super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar10 + (long)p_Var16;
    local_48.
    super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = pTVar10;
  }
  else {
    (local_48.
     super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
     ._M_impl.super__Vector_impl_data._M_finish)->scanned = (bool)local_80[8];
    ((local_48.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish)->node).inst = (Value *)local_80._0_8_;
    ((local_48.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish)->children).
    super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_80._16_8_;
    ((local_48.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish)->children).
    super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.super__Vector_impl_data.
    _M_finish = pRStack_68;
    ((local_48.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish)->children).
    super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_60;
    local_80._16_8_ = (pointer)0x0;
    pRStack_68 = (pointer)0x0;
    local_60 = (pointer)0x0;
    pTVar19 = local_48.
              super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_48.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = pTVar19 + 1;
  if ((pointer)local_80._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_80._16_8_,(long)local_60 - local_80._16_8_);
  }
  if (local_48.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pTVar8 = local_48.
               super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __n = (Value *)local_80;
      if (local_48.
          super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].scanned == false) {
        local_48.
        super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].scanned = true;
        local_80._0_8_ =
             local_48.
             super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].node.inst;
        if ((visitPre->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00151f2f;
        (*visitPre->_M_invoker)((_Any_data *)visitPre,(Ref *)__n);
        pRVar3 = pTVar8[-1].children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        local_50 = local_48.
                   super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pTVar19 = local_58;
        local_58 = local_48.
                   super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pTVar11 = local_48.
                  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pRVar17 = pTVar8[-1].children.
                       super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
                       super__Vector_impl_data._M_start; pTVar8 = local_58, pTVar9 = local_50,
            pRVar17 != pRVar3; pRVar17 = pRVar17 + 1) {
          node_00.inst = pRVar17->inst;
          if (pTVar11 == local_50) {
            lVar18 = (long)pTVar11 - (long)local_58;
            if (lVar18 == 0x7ffffffffffffff8) {
              local_48.
              super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
              ._M_impl.super__Vector_impl_data._M_start = local_58;
              local_48.
              super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish = pTVar11;
              local_48.
              super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = local_50;
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar12 = (lVar18 >> 3) * -0x3333333333333333;
            uVar15 = uVar12;
            if (pTVar11 == local_58) {
              uVar15 = 1;
            }
            p_Var16 = (_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                       *)(uVar15 + uVar12);
            if ((_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                 *)0x333333333333332 < p_Var16) {
              p_Var16 = (_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                         *)0x333333333333333;
            }
            if (CARRY8(uVar15,uVar12)) {
              p_Var16 = (_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                         *)0x333333333333333;
            }
            pTVar13 = std::
                      _Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                      ::_M_allocate(p_Var16,(size_t)__n);
            TraverseInfo::TraverseInfo((TraverseInfo *)(lVar18 + (long)pTVar13),node_00);
            pTVar19 = pTVar13;
            for (pTVar14 = local_58; pTVar11 != pTVar14; pTVar14 = pTVar14 + 1) {
              pTVar19->scanned = pTVar14->scanned;
              (pTVar19->node).inst = (pTVar14->node).inst;
              pRVar7 = (pTVar14->children).
                       super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              (pTVar19->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pTVar14->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (pTVar19->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
              _M_impl.super__Vector_impl_data._M_finish = pRVar7;
              (pTVar19->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pTVar14->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (pTVar14->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (pTVar14->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (pTVar14->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pTVar19 = pTVar19 + 1;
            }
            if (local_58 != (TraverseInfo *)0x0) {
              node_00.inst = (Value *)((long)local_50 - (long)local_58);
              operator_delete(local_58,(ulong)node_00.inst);
            }
            local_50 = pTVar13 + (long)p_Var16;
          }
          else {
            TraverseInfo::TraverseInfo(pTVar11,node_00);
            pTVar13 = local_58;
            pTVar19 = pTVar11;
          }
          pTVar11 = pTVar19 + 1;
          __n = node_00.inst;
          pTVar19 = local_58;
          local_58 = pTVar13;
        }
      }
      else {
        pVVar2 = local_48.
                 super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].node.inst;
        pRVar17 = local_48.
                  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].children.
                  super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pTVar19 = local_48.
                  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        if (pRVar17 != (pointer)0x0) {
          pTVar19 = local_48.
                    super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1;
          local_48.
          super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_48.
               super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          operator_delete(pRVar17,(long)(pTVar19->children).
                                        super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pRVar17);
          pTVar19 = local_48.
                    super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        local_48.
        super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTVar19;
        local_80._0_8_ = pVVar2;
        if ((visitPost->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
LAB_00151f2f:
          std::__throw_bad_function_call();
          goto LAB_00151f34;
        }
        (*visitPost->_M_invoker)((_Any_data *)visitPost,(Ref *)__n);
        pTVar19 = local_58;
        pTVar8 = local_48.
                 super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pTVar11 = local_48.
                  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pTVar9 = local_48.
                 super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      local_48.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar9;
      local_48.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = pTVar11;
      local_48.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = pTVar8;
      local_58 = pTVar19;
    } while (local_48.
             super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_48.
             super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ::~vector(&local_48);
  return;
}

Assistant:

static void traversePrePost(Ref node,
                            std::function<void(Ref)> visitPre,
                            std::function<void(Ref)> visitPost) {
  std::vector<TraverseInfo> stack;
  stack.push_back(TraverseInfo(node));
  while (!stack.empty()) {
    TraverseInfo& back = stack.back();
    if (!back.scanned) {
      back.scanned = true;
      // This is the first time we see this.
      visitPre(back.node);
      for (auto child : back.children) {
        stack.emplace_back(child);
      }
      continue;
    }
    // Time to post-visit the node itself
    auto node = back.node;
    stack.pop_back();
    visitPost(node);
  }
}